

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdantzigpr.hpp
# Opt level: O2

int __thiscall
soplex::
SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectLeaveSparse(SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  pointer pnVar5;
  undefined8 uVar6;
  int *piVar7;
  type_conflict5 tVar8;
  ulong uVar9;
  ulong uVar10;
  int local_ec;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  
  result.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)
        ((this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.data._M_elems + 8);
  result.m_backend.data._M_elems._0_8_ =
       *(undefined8 *)
        (this->
        super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thetolerance.m_backend.data._M_elems;
  result.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)
        ((this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.data._M_elems + 2);
  result.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)
        ((this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.data._M_elems + 4);
  result.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)
        ((this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.data._M_elems + 6);
  result.m_backend.exp =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.exp;
  result.m_backend.neg =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.neg;
  result.m_backend.fpclass =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.fpclass;
  result.m_backend.prec_elem =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.prec_elem;
  if (result.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0) {
    result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
  }
  uVar9 = (ulong)(uint)(((this->
                         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).thesolver)->infeasibilities).super_IdxSet.num;
  local_ec = -1;
LAB_0023907b:
  uVar10 = uVar9 & 0xffffffff;
  do {
    uVar9 = uVar9 - 1;
    if ((int)uVar10 < 1) {
      return local_ec;
    }
    pSVar4 = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    pnVar5 = (pSVar4->theCoTest).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar2 = (pSVar4->infeasibilities).super_IdxSet.idx[uVar9];
    uVar6 = *(undefined8 *)((long)&pnVar5[iVar2].m_backend.data + 0x20);
    local_e8.m_backend.data._M_elems._32_5_ = SUB85(uVar6,0);
    local_e8.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar5[iVar2].m_backend.data;
    local_e8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((long)&pnVar5[iVar2].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[iVar2].m_backend.data + 0x10);
    local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    uVar6 = *(undefined8 *)(puVar1 + 2);
    local_e8.m_backend.data._M_elems._24_5_ = SUB85(uVar6,0);
    local_e8.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    local_e8.m_backend.exp = pnVar5[iVar2].m_backend.exp;
    local_e8.m_backend.neg = pnVar5[iVar2].m_backend.neg;
    local_e8.m_backend.fpclass = pnVar5[iVar2].m_backend.fpclass;
    local_e8.m_backend.prec_elem = pnVar5[iVar2].m_backend.prec_elem;
    result_1.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)
          ((this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.data._M_elems + 8);
    result_1.m_backend.data._M_elems._0_8_ =
         *(undefined8 *)
          (this->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thetolerance.m_backend.data._M_elems;
    result_1.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)
          ((this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.data._M_elems + 2);
    result_1.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)
          ((this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.data._M_elems + 4);
    result_1.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)
          ((this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.data._M_elems + 6);
    result_1.m_backend.exp =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.exp;
    result_1.m_backend.neg =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.neg;
    result_1.m_backend.fpclass =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.fpclass;
    result_1.m_backend.prec_elem =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.prec_elem;
    if (result_1.m_backend.fpclass != cpp_dec_float_finite ||
        result_1.m_backend.data._M_elems[0] != 0) {
      result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
    }
    tVar8 = boost::multiprecision::operator<(&local_e8,&result_1);
    if (tVar8) {
      tVar8 = boost::multiprecision::operator<(&local_e8,&result);
      if (tVar8) break;
    }
    else {
      pSVar4 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      piVar7 = (pSVar4->infeasibilities).super_IdxSet.idx;
      iVar3 = (pSVar4->infeasibilities).super_IdxSet.num;
      (pSVar4->infeasibilities).super_IdxSet.num = iVar3 + -1;
      piVar7[uVar9] = piVar7[(long)iVar3 + -1];
      (pSVar4->isInfeasible).data[iVar2] = 0;
    }
    uVar10 = (ulong)((int)uVar10 - 1);
  } while( true );
  result.m_backend.data._M_elems[9]._1_3_ = local_e8.m_backend.data._M_elems[9]._1_3_;
  result.m_backend.data._M_elems._32_5_ = local_e8.m_backend.data._M_elems._32_5_;
  result.m_backend.data._M_elems[7]._1_3_ = local_e8.m_backend.data._M_elems[7]._1_3_;
  result.m_backend.data._M_elems._24_5_ = local_e8.m_backend.data._M_elems._24_5_;
  result.m_backend.data._M_elems[4] = local_e8.m_backend.data._M_elems[4];
  result.m_backend.data._M_elems[5] = local_e8.m_backend.data._M_elems[5];
  result.m_backend.data._M_elems[0] = local_e8.m_backend.data._M_elems[0];
  result.m_backend.data._M_elems[1] = local_e8.m_backend.data._M_elems[1];
  result.m_backend.data._M_elems[2] = local_e8.m_backend.data._M_elems[2];
  result.m_backend.data._M_elems[3] = local_e8.m_backend.data._M_elems[3];
  result.m_backend.exp = local_e8.m_backend.exp;
  result.m_backend.neg = local_e8.m_backend.neg;
  result.m_backend.fpclass = local_e8.m_backend.fpclass;
  result.m_backend.prec_elem = local_e8.m_backend.prec_elem;
  local_ec = iVar2;
  goto LAB_0023907b;
}

Assistant:

int SPxDantzigPR<R>::selectLeaveSparse()
{
   assert(this->thesolver != nullptr);

   R best   = -this->thetolerance;
   R x;
   int  n      = -1;
   int  index;

   for(int i = this->thesolver->infeasibilities.size() - 1; i >= 0; --i)
   {
      index = this->thesolver->infeasibilities.index(i);
      x = this->thesolver->fTest()[index];

      if(x < -this->thetolerance)
      {
         if(x < best)
         {
            n    = index;
            best = x;
         }
      }
      else
      {
         this->thesolver->infeasibilities.remove(i);
         assert(this->thesolver->isInfeasible[index] > 0);
         this->thesolver->isInfeasible[index] = 0;
      }
   }

   return n;
}